

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_transfer.cpp
# Opt level: O0

void Omega_h::transfer_inherit_refine<signed_char>
               (Mesh *old_mesh,Mesh *new_mesh,LOs *keys2edges,Int prod_dim,LOs *keys2prods,
               LOs *prods2new_ents,LOs *same_ents2old_ents,LOs *same_ents2new_ents,string *name)

{
  int size_in;
  LO n;
  Int IVar1;
  Tag<signed_char> *this;
  Write<signed_char> local_280;
  Read<signed_char> local_270;
  Read<int> local_260;
  Read<int> local_250;
  Read<int> local_240;
  undefined1 local_230 [8];
  type f_1;
  LOs edge_doms2doms_1;
  LOs edges2edge_doms_1;
  Graph edges2doms_1;
  Read<signed_char> dom_data_1;
  undefined1 local_170 [4];
  int dom_dim_1;
  type f;
  LOs edge_doms2doms;
  LOs edges2edge_doms;
  Graph edges2doms;
  Read<signed_char> dom_data;
  Int dom_dim;
  LO nkeys;
  allocator local_99;
  string local_98 [32];
  undefined1 local_78 [8];
  Write<signed_char> prod_data;
  int nprods;
  Int ncomps;
  Tag<signed_char> *old_tag;
  LOs *prods2new_ents_local;
  LOs *keys2prods_local;
  Int prod_dim_local;
  LOs *keys2edges_local;
  Mesh *new_mesh_local;
  Mesh *old_mesh_local;
  ulong local_10;
  
  this = Mesh::get_tag<signed_char>(old_mesh,prod_dim,name);
  prod_data.shared_alloc_.direct_ptr._4_4_ = TagBase::ncomps(&this->super_TagBase);
  prod_data.shared_alloc_.direct_ptr._0_4_ = Read<int>::last(keys2prods);
  size_in = (int)prod_data.shared_alloc_.direct_ptr * prod_data.shared_alloc_.direct_ptr._4_4_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"",&local_99);
  Write<signed_char>::Write((Write<signed_char> *)local_78,size_in,(string *)local_98);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (((ulong)(keys2edges->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((keys2edges->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(keys2edges->write_).shared_alloc_.alloc >> 3;
  }
  n = (LO)(local_10 >> 2);
  if (0 < prod_dim) {
    Mesh::get_array<signed_char>
              ((Mesh *)&edges2doms.ab2b.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
               (string *)(ulong)(uint)prod_dim);
    Mesh::ask_graph((Graph *)&edges2edge_doms.write_.shared_alloc_.direct_ptr,old_mesh,1,prod_dim);
    Read<int>::Read((Read<int> *)&edge_doms2doms.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edges2edge_doms.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.dom_data.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edges2doms.a2ab.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)local_170,keys2edges);
    Read<int>::Read((Read<int> *)&f.keys2edges.write_.shared_alloc_.direct_ptr,keys2prods);
    Read<int>::Read((Read<int> *)&f.keys2prods.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edge_doms2doms.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f.edges2edge_doms.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&f.dom_data.write_.shared_alloc_.direct_ptr);
    f.edge_doms2doms.write_.shared_alloc_.direct_ptr._0_4_ =
         prod_data.shared_alloc_.direct_ptr._4_4_;
    Write<signed_char>::Write((Write<signed_char> *)&f.ncomps,(Write<signed_char> *)local_78);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f.prod_data.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&edges2doms.ab2b.write_.shared_alloc_.direct_ptr);
    parallel_for<Omega_h::transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_1_>
              (n,(type *)local_170,"transfer_inherit_refine(pairs)");
    transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#1}::~basic_string((_lambda_int__1_ *)local_170);
    Read<int>::~Read((Read<int> *)&f.dom_data.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&edge_doms2doms.write_.shared_alloc_.direct_ptr);
    Graph::~Graph((Graph *)&edges2edge_doms.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&edges2doms.ab2b.write_.shared_alloc_.direct_ptr);
  }
  IVar1 = Mesh::dim(old_mesh);
  if (prod_dim < IVar1) {
    Mesh::get_array<signed_char>
              ((Mesh *)&edges2doms_1.ab2b.write_.shared_alloc_.direct_ptr,(Int)old_mesh,
               (string *)(ulong)(prod_dim + 1U));
    Mesh::ask_graph((Graph *)&edges2edge_doms_1.write_.shared_alloc_.direct_ptr,old_mesh,1,
                    prod_dim + 1U);
    Read<int>::Read((Read<int> *)&edge_doms2doms_1.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edges2edge_doms_1.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f_1.dom_data.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edges2doms_1.a2ab.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)local_230,keys2edges);
    Read<int>::Read((Read<int> *)&f_1.keys2edges.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&edge_doms2doms_1.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&f_1.edges2edge_doms.write_.shared_alloc_.direct_ptr,keys2prods);
    Read<int>::Read((Read<int> *)&f_1.keys2prods.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)&f_1.dom_data.write_.shared_alloc_.direct_ptr);
    f_1.edge_doms2doms.write_.shared_alloc_.direct_ptr._0_4_ =
         prod_data.shared_alloc_.direct_ptr._4_4_;
    Write<signed_char>::Write((Write<signed_char> *)&f_1.ncomps,(Write<signed_char> *)local_78);
    Read<signed_char>::Read
              ((Read<signed_char> *)&f_1.prod_data.shared_alloc_.direct_ptr,
               (Read<signed_char> *)&edges2doms_1.ab2b.write_.shared_alloc_.direct_ptr);
    parallel_for<Omega_h::transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)::_lambda(int)_2_>
              (n,(type *)local_230,"transfer_inherit_refine(cuts)");
    transfer_inherit_refine<signed_char>(Omega_h::Mesh*,Omega_h::Mesh*,Omega_h::Read<int>,int,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,std::__cxx11::string_const&)
    ::{lambda(int)#2}::~basic_string((_lambda_int__2_ *)local_230);
    Read<int>::~Read((Read<int> *)&f_1.dom_data.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&edge_doms2doms_1.write_.shared_alloc_.direct_ptr);
    Graph::~Graph((Graph *)&edges2edge_doms_1.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read
              ((Read<signed_char> *)&edges2doms_1.ab2b.write_.shared_alloc_.direct_ptr);
  }
  Read<int>::Read(&local_240,same_ents2old_ents);
  Read<int>::Read(&local_250,same_ents2new_ents);
  Read<int>::Read(&local_260,prods2new_ents);
  Write<signed_char>::Write(&local_280,(Write<signed_char> *)local_78);
  Read<signed_char>::Read(&local_270,&local_280);
  transfer_common<signed_char>
            (old_mesh,new_mesh,prod_dim,&local_240,&local_250,&local_260,&this->super_TagBase,
             &local_270);
  Read<signed_char>::~Read(&local_270);
  Write<signed_char>::~Write(&local_280);
  Read<int>::~Read(&local_260);
  Read<int>::~Read(&local_250);
  Read<int>::~Read(&local_240);
  Write<signed_char>::~Write((Write<signed_char> *)local_78);
  return;
}

Assistant:

void transfer_inherit_refine(Mesh* old_mesh, Mesh* new_mesh, LOs keys2edges,
    Int prod_dim, LOs keys2prods, LOs prods2new_ents, LOs same_ents2old_ents,
    LOs same_ents2new_ents, std::string const& name) {
  auto old_tag = old_mesh->get_tag<T>(prod_dim, name);
  auto ncomps = old_tag->ncomps();
  auto nprods = keys2prods.last();
  auto prod_data = Write<T>(nprods * ncomps);
  auto nkeys = keys2edges.size();
  /* transfer pairs */
  if (prod_dim > VERT) {
    auto dom_dim = prod_dim;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto prod = keys2prods[key];
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int pair = 0; pair < 2; ++pair) {
          for (Int comp = 0; comp < ncomps; ++comp) {
            prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
          }
          ++prod;
        }
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(pairs)");
  }
  if (prod_dim < old_mesh->dim()) {
    auto dom_dim = prod_dim + 1;
    auto dom_data = old_mesh->get_array<T>(dom_dim, name);
    auto edges2doms = old_mesh->ask_graph(EDGE, dom_dim);
    auto edges2edge_doms = edges2doms.a2ab;
    auto edge_doms2doms = edges2doms.ab2b;
    auto f = OMEGA_H_LAMBDA(LO key) {
      auto edge = keys2edges[key];
      auto ndoms = edges2edge_doms[edge + 1] - edges2edge_doms[edge];
      auto prod = keys2prods[key + 1] - ndoms;
      for (auto edge_dom = edges2edge_doms[edge];
           edge_dom < edges2edge_doms[edge + 1]; ++edge_dom) {
        auto dom = edge_doms2doms[edge_dom];
        for (Int comp = 0; comp < ncomps; ++comp) {
          prod_data[prod * ncomps + comp] = dom_data[dom * ncomps + comp];
        }
        ++prod;
      }
    };
    parallel_for(nkeys, f, "transfer_inherit_refine(cuts)");
  }
  transfer_common(old_mesh, new_mesh, prod_dim, same_ents2old_ents,
      same_ents2new_ents, prods2new_ents, old_tag, Read<T>(prod_data));
}